

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

NFSubstitution *
icu_63::NFSubstitution::makeSubstitution
          (int32_t pos,NFRule *rule,NFRule *predecessor,NFRuleSet *ruleSet,
          RuleBasedNumberFormat *formatter,UnicodeString *description,UErrorCode *status)

{
  short sVar1;
  char16_t cVar2;
  char16_t *pcVar3;
  NFSubstitution *pNVar4;
  undefined **ppuVar5;
  FractionalPartSubstitution *this;
  NumeratorSubstitution *this_00;
  ModulusSubstitution *this_01;
  MultiplierSubstitution *this_02;
  int iVar6;
  
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if (iVar6 == 0) {
    return (NFSubstitution *)0x0;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar3 = (description->fUnion).fFields.fArray;
  }
  else {
    pcVar3 = (description->fUnion).fStackFields.fBuffer;
  }
  cVar2 = *pcVar3;
  if (cVar2 == L'>') {
    if (rule->baseValue + 4U < 3) {
      this = (FractionalPartSubstitution *)UMemory::operator_new((UMemory *)0x28,(size_t)rule);
      if (this == (FractionalPartSubstitution *)0x0) {
        return (NFSubstitution *)0x0;
      }
      FractionalPartSubstitution::FractionalPartSubstitution(this,pos,ruleSet,description,status);
      return &this->super_NFSubstitution;
    }
    if (rule->baseValue == -1) {
      pNVar4 = (NFSubstitution *)UMemory::operator_new((UMemory *)0x20,(size_t)rule);
      if (pNVar4 == (NFSubstitution *)0x0) {
        return (NFSubstitution *)0x0;
      }
      NFSubstitution(pNVar4,pos,ruleSet,description,status);
      ppuVar5 = &PTR__AbsoluteValueSubstitution_003e80b0;
LAB_00262d0d:
      (pNVar4->super_UObject)._vptr_UObject = (_func_int **)ppuVar5;
      return pNVar4;
    }
    if (ruleSet->fIsFractionRuleSet == '\0') {
      this_01 = (ModulusSubstitution *)UMemory::operator_new((UMemory *)0x30,(size_t)rule);
      if (this_01 == (ModulusSubstitution *)0x0) {
        return (NFSubstitution *)0x0;
      }
      ModulusSubstitution::ModulusSubstitution
                (this_01,pos,rule,predecessor,ruleSet,description,status);
      return &this_01->super_NFSubstitution;
    }
  }
  else {
    if (cVar2 == L'=') {
      pNVar4 = (NFSubstitution *)UMemory::operator_new((UMemory *)0x20,(size_t)rule);
      if (pNVar4 == (NFSubstitution *)0x0) {
        return (NFSubstitution *)0x0;
      }
      SameValueSubstitution::SameValueSubstitution
                ((SameValueSubstitution *)pNVar4,pos,ruleSet,description,status);
      return pNVar4;
    }
    if (cVar2 == L'<') {
      if (rule->baseValue + 4U < 3) {
        pNVar4 = (NFSubstitution *)UMemory::operator_new((UMemory *)0x20,(size_t)rule);
        if (pNVar4 == (NFSubstitution *)0x0) {
          return (NFSubstitution *)0x0;
        }
        NFSubstitution(pNVar4,pos,ruleSet,description,status);
        ppuVar5 = &PTR__IntegralPartSubstitution_003e7ff8;
        goto LAB_00262d0d;
      }
      if (rule->baseValue != -1) {
        if (ruleSet->fIsFractionRuleSet == '\0') {
          this_02 = (MultiplierSubstitution *)UMemory::operator_new((UMemory *)0x28,(size_t)rule);
          if (this_02 == (MultiplierSubstitution *)0x0) {
            return (NFSubstitution *)0x0;
          }
          MultiplierSubstitution::MultiplierSubstitution
                    (this_02,pos,rule,ruleSet,description,status);
          return &this_02->super_NFSubstitution;
        }
        this_00 = (NumeratorSubstitution *)UMemory::operator_new((UMemory *)0x38,(size_t)rule);
        if (this_00 == (NumeratorSubstitution *)0x0) {
          return (NFSubstitution *)0x0;
        }
        NumeratorSubstitution::NumeratorSubstitution
                  (this_00,pos,(double)rule->baseValue,formatter->defaultRuleSet,description,status)
        ;
        return &this_00->super_NFSubstitution;
      }
    }
  }
  *status = U_PARSE_ERROR;
  return (NFSubstitution *)0x0;
}

Assistant:

NFSubstitution*
NFSubstitution::makeSubstitution(int32_t pos,
                                 const NFRule* rule,
                                 const NFRule* predecessor,
                                 const NFRuleSet* ruleSet,
                                 const RuleBasedNumberFormat* formatter,
                                 const UnicodeString& description,
                                 UErrorCode& status)
{
    // if the description is empty, return a NullSubstitution
    if (description.length() == 0) {
        return NULL;
    }

    switch (description.charAt(0)) {
        // if the description begins with '<'...
    case gLessThan:
        // throw an exception if the rule is a negative number
        // rule
        if (rule->getBaseValue() == NFRule::kNegativeNumberRule) {
            // throw new IllegalArgumentException("<< not allowed in negative-number rule");
            status = U_PARSE_ERROR;
            return NULL;
        }

        // if the rule is a fraction rule, return an
        // IntegralPartSubstitution
        else if (rule->getBaseValue() == NFRule::kImproperFractionRule
            || rule->getBaseValue() == NFRule::kProperFractionRule
            || rule->getBaseValue() == NFRule::kMasterRule) {
            return new IntegralPartSubstitution(pos, ruleSet, description, status);
        }

        // if the rule set containing the rule is a fraction
        // rule set, return a NumeratorSubstitution
        else if (ruleSet->isFractionRuleSet()) {
            return new NumeratorSubstitution(pos, (double)rule->getBaseValue(),
                formatter->getDefaultRuleSet(), description, status);
        }

        // otherwise, return a MultiplierSubstitution
        else {
            return new MultiplierSubstitution(pos, rule, ruleSet,
                description, status);
        }

        // if the description begins with '>'...
    case gGreaterThan:
        // if the rule is a negative-number rule, return
        // an AbsoluteValueSubstitution
        if (rule->getBaseValue() == NFRule::kNegativeNumberRule) {
            return new AbsoluteValueSubstitution(pos, ruleSet, description, status);
        }

        // if the rule is a fraction rule, return a
        // FractionalPartSubstitution
        else if (rule->getBaseValue() == NFRule::kImproperFractionRule
            || rule->getBaseValue() == NFRule::kProperFractionRule
            || rule->getBaseValue() == NFRule::kMasterRule) {
            return new FractionalPartSubstitution(pos, ruleSet, description, status);
        }

        // if the rule set owning the rule is a fraction rule set,
        // throw an exception
        else if (ruleSet->isFractionRuleSet()) {
            // throw new IllegalArgumentException(">> not allowed in fraction rule set");
            status = U_PARSE_ERROR;
            return NULL;
        }

        // otherwise, return a ModulusSubstitution
        else {
            return new ModulusSubstitution(pos, rule, predecessor,
                ruleSet, description, status);
        }

        // if the description begins with '=', always return a
        // SameValueSubstitution
    case gEquals:
        return new SameValueSubstitution(pos, ruleSet, description, status);

        // and if it's anything else, throw an exception
    default:
        // throw new IllegalArgumentException("Illegal substitution character");
        status = U_PARSE_ERROR;
    }
    return NULL;
}